

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddPchDependencies(cmLocalGenerator *this,cmGeneratorTarget *target)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *language;
  long lVar1;
  cmTarget *pcVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  string *language_00;
  bool bVar5;
  int iVar6;
  TargetType TVar7;
  cmValue cVar8;
  cmSourceFile *pcVar9;
  string *psVar10;
  iterator iVar11;
  ostream *poVar12;
  ulong uVar13;
  size_type sVar14;
  _Alloc_hider _Var15;
  pointer pbVar16;
  iterator __begin4;
  pointer arch;
  iterator __end4;
  long lVar17;
  pointer ppcVar18;
  pointer ppcVar19;
  undefined1 *puVar20;
  bool bVar21;
  bool bVar22;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  string_view source;
  string compilerVersion;
  string useMultiArchPch;
  string err;
  string pchFile;
  string pchHeader_1;
  string langFlags;
  string pchHeader;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  string configUpper;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pchLangSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configsList;
  string local_3b8;
  string local_398;
  string *local_378;
  string local_370;
  string local_350;
  string local_330;
  string *local_310;
  string local_308;
  cmGeneratorTarget *local_2e8;
  string *local_2e0;
  string local_2d8;
  undefined1 local_2b8 [32];
  char *local_298 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_288 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  ios_base local_248 [264];
  undefined8 local_140;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  long local_100;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  string local_b8;
  string *local_98;
  cmOutputConverter *local_90;
  cmListFileBacktrace *local_88;
  string *local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_48,this->Makefile,IncludeEmptyConfig);
  local_98 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_90 = &this->super_cmOutputConverter;
    local_88 = &this->DirectoryBacktrace;
    local_140 = 0x862d70;
    pbVar16 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetSourceFiles(target,&local_138,pbVar16);
      cmsys::SystemTools::UpperCase(&local_b8,pbVar16);
      local_378 = pbVar16;
      if ((AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_ == '\0') &&
         (iVar6 = __cxa_guard_acquire(&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_),
         iVar6 != 0)) {
        AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[0]._M_dataplus._M_p =
             (pointer)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_,"C","");
        AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[1]._M_dataplus._M_p =
             (pointer)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[1].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems + 1)
                   ,"CXX","");
        AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[2]._M_dataplus._M_p =
             (pointer)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[2].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems + 2)
                   ,"OBJC","");
        AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[3]._M_dataplus._M_p =
             (pointer)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[3].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems + 3)
                   ,"OBJCXX","");
        __cxa_atexit(std::
                     array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                     ::~array,&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_);
        pbVar16 = local_378;
      }
      local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_78._M_impl.super__Rb_tree_header._M_header;
      local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_right =
           local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
      if ((char)iVar6 != '\0') {
        lVar17 = 0;
        do {
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"");
          language = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[0].
                             _M_dataplus._M_p + lVar17);
          cmGeneratorTarget::GetPchHeader((string *)local_2b8,target,pbVar16,language,&local_398);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,
                            (ulong)(local_398.field_2._M_allocated_capacity + 1));
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_emplace_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_78,language);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 0x10)) {
            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
          }
          lVar17 = lVar17 + 0x20;
        } while (lVar17 != 0x80);
      }
      lVar17 = 0;
      do {
        ppcVar19 = local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        ppcVar18 = local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_d8 = local_c8;
        lVar1 = *(long *)((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems
                                 [0]._M_dataplus._M_p + lVar17);
        local_100 = lVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,lVar1,
                   *(long *)((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_.
                                    _M_elems[0]._M_string_length + lVar17) + lVar1);
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_350,local_d8,local_d0 + (long)local_d8);
        local_2b8._0_8_ = local_2b8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b8,local_350._M_dataplus._M_p,
                   (char *)((long)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_350._M_string_length + (long)local_350._M_dataplus._M_p))
        ;
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_330,local_2b8._0_8_,
                   (char *)((long)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2b8._8_8_ + local_2b8._0_8_));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 0x10)) {
          operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
        }
        if (ppcVar18 == ppcVar19) {
          bVar21 = true;
        }
        else {
          lVar17 = 0;
          do {
            pcVar9 = *ppcVar18;
            cmSourceFile::GetLanguage_abi_cxx11_((string *)local_2b8,pcVar9);
            if ((local_330._M_string_length == local_2b8._8_8_) &&
               (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_330._M_string_length ==
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
                (iVar6 = bcmp(local_330._M_dataplus._M_p,(void *)local_2b8._0_8_,
                              local_330._M_string_length), iVar6 == 0)))) {
              local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
              local_370._M_dataplus._M_p = (pointer)0x17;
              local_398._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_398,(ulong)&local_370);
              local_398.field_2._M_allocated_capacity = (size_type)local_370._M_dataplus._M_p;
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._M_dataplus._M_p)->
                   _vptr__Sp_counted_base)->_M_allocated_capacity = 0x4552505f50494b53;
              *(undefined8 *)
               &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._M_dataplus._M_p)->
                _M_use_count = 0x5f454c49504d4f43;
              *(undefined8 *)
               ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._M_dataplus._M_p)
                       ->_M_weak_count + 3) = 0x535245444145485f;
              local_398._M_string_length = (size_type)local_370._M_dataplus._M_p;
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._M_dataplus._M_p)->
                   _vptr__Sp_counted_base)->_M_local_buf[(long)local_370._M_dataplus._M_p] = '\0';
              cVar8 = cmSourceFile::GetProperty(pcVar9,&local_398);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_dataplus._M_p != &local_398.field_2) {
                operator_delete(local_398._M_dataplus._M_p,
                                (ulong)(local_398.field_2._M_allocated_capacity + 1));
              }
              uVar13 = (ulong)(cVar8.Value == (string *)0x0);
            }
            else {
              uVar13 = 0;
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 0x10)) {
              operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
            }
            lVar17 = lVar17 + uVar13;
            ppcVar18 = ppcVar18 + 1;
          } while (ppcVar18 != ppcVar19);
          bVar21 = lVar17 == 0;
        }
        psVar10 = local_378;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != local_c8) {
          operator_delete(local_d8,local_c8[0] + 1);
        }
        if (!bVar21) {
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
          if ((char)iVar6 == '\0') {
            cmGeneratorTarget::GetAppleArchs(target,psVar10,&local_118);
          }
          pbVar16 = local_118.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_310 = (string *)
                      ((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[0].
                              _M_dataplus._M_p + local_100);
          if (local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>(&local_118);
          }
          else {
            local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
            local_398._M_string_length = 0;
            local_398.field_2._M_allocated_capacity =
                 local_398.field_2._M_allocated_capacity & 0xffffffffffffff00;
            arch = local_118.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            do {
              cmGeneratorTarget::GetPchHeader(&local_330,target,psVar10,local_310,arch);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_330._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_2b8._0_8_ = local_398._M_string_length;
                local_2b8._8_8_ = local_398._M_dataplus._M_p;
                local_2b8._16_8_ = 8;
                local_2b8._24_8_ = ";-Xarch_";
                local_298[1] = (arch->_M_dataplus)._M_p;
                local_298[0] = (char *)arch->_M_string_length;
                local_288[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x9;
                local_288[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6b07fe;
                local_288[2] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_330._M_string_length;
                local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_330._M_dataplus._M_p;
                views._M_len = 5;
                views._M_array = (iterator)local_2b8;
                cmCatViews_abi_cxx11_(&local_350,views);
                std::__cxx11::string::operator=((string *)&local_398,(string *)&local_350);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) {
                  operator_delete(local_350._M_dataplus._M_p,
                                  local_350.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
              arch = arch + 1;
            } while (arch != pbVar16);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              pcVar2 = target->Target;
              local_2b8._8_8_ = (local_310->_M_dataplus)._M_p;
              local_2b8._0_8_ = local_310->_M_string_length;
              local_2b8._16_8_ = 0x18;
              local_2b8._24_8_ = "_COMPILE_OPTIONS_USE_PCH";
              views_00._M_len = 2;
              views_00._M_array = (iterator)local_2b8;
              cmCatViews_abi_cxx11_(&local_330,views_00);
              local_2b8._24_8_ = (psVar10->_M_dataplus)._M_p;
              local_2b8._16_8_ = psVar10->_M_string_length;
              local_2b8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
              local_2b8._8_8_ = "$<$<CONFIG:";
              local_298[0] = (undefined1 *)0x2;
              local_298[1] = ">:";
              local_288[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_398._M_string_length;
              local_288[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_398._M_dataplus._M_p;
              local_288[2] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
              local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x6b5e9c;
              views_01._M_len = 5;
              views_01._M_array = (iterator)local_2b8;
              cmCatViews_abi_cxx11_(&local_350,views_01);
              local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
              cmTarget::AppendProperty
                        (pcVar2,&local_330,&local_350,(optional<cmListFileBacktrace> *)local_2b8,
                         false);
              if ((local_2b8[0x10] == '\x01') &&
                 (local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00,
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._M_dataplus._M_p != &local_350.field_2) {
                operator_delete(local_350._M_dataplus._M_p,
                                local_350.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              operator_delete(local_398._M_dataplus._M_p,
                              (ulong)(local_398.field_2._M_allocated_capacity + 1));
            }
          }
          local_80 = local_118.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          pbVar16 = local_118.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              language_00 = local_310;
              psVar10 = local_378;
              cmGeneratorTarget::GetPchSource(&local_398,target,local_378,local_310,pbVar16);
              cmGeneratorTarget::GetPchHeader(&local_330,target,psVar10,language_00,pbVar16);
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._M_string_length ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_330._M_string_length ==
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
                ppcVar18 = local_138.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                ppcVar19 = local_138.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                if (((byte)iVar6 & local_78._M_impl.super__Rb_tree_header._M_node_count != 0) == 1)
                {
                  for (; ppcVar19 != ppcVar18; ppcVar19 = ppcVar19 + 1) {
                    pcVar9 = *ppcVar19;
                    cmSourceFile::GetLanguage_abi_cxx11_((string *)local_2b8,pcVar9);
                    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (iVar11 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::find(&local_78,(string *)local_2b8),
                       (_Rb_tree_header *)iVar11._M_node == &local_78._M_impl.super__Rb_tree_header)
                       ) {
                      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_350,"SKIP_PRECOMPILE_HEADERS","");
                      cmSourceFile::SetProperty(pcVar9,&local_350,"ON");
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_350._M_dataplus._M_p != &local_350.field_2) {
                        operator_delete(local_350._M_dataplus._M_p,
                                        local_350.field_2._M_allocated_capacity + 1);
                      }
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 0x10)) {
                      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
                    }
                  }
                }
              }
              else {
                pcVar3 = this->Makefile;
                local_2b8._0_8_ = local_2b8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2b8,"CMAKE_PCH_EXTENSION","");
                cVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_2b8);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 0x10)) {
                  operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
                }
                if ((cVar8.Value != (string *)0x0) && ((cVar8.Value)->_M_string_length != 0)) {
                  local_2b8._0_8_ = local_2b8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2b8,"PRECOMPILE_HEADERS_REUSE_FROM","");
                  local_2e0 = (string *)cmGeneratorTarget::GetProperty(target,(string *)local_2b8);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 0x10)) {
                    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
                  }
                  pcVar9 = cmMakefile::GetOrCreateSource(this->Makefile,&local_398,false,Known);
                  iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
                  if ((char)iVar6 == '\0') {
                    if (local_2e0 == (string *)0x0) {
                      cmGeneratorTarget::AddSource(target,&local_398,true);
                    }
                    cmGeneratorTarget::GetPchFile(&local_350,target,local_378,local_310,pbVar16);
                    pcVar3 = this->Makefile;
                    local_2b8._0_8_ = local_2b8 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2b8,"CMAKE_LINK_PCH","");
                    bVar21 = cmMakefile::IsOn(pcVar3,(string *)local_2b8);
                    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
                      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
                    }
                    if (bVar21) {
                      if (local_2e0 == (string *)0x0) {
                        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_370,"OBJECT_OUTPUTS","");
                        local_2b8._24_8_ = (local_378->_M_dataplus)._M_p;
                        local_2b8._16_8_ = local_378->_M_string_length;
                        local_2b8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
                        local_2b8._8_8_ = "$<$<CONFIG:";
                        local_298[0] = (undefined1 *)0x2;
                        local_298[1] = ">:";
                        local_288[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_350._M_string_length;
                        local_288[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_350._M_dataplus._M_p;
                        local_288[2] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
                        local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)0x6b5e9c;
                        views_05._M_len = 5;
                        views_05._M_array = (iterator)local_2b8;
                        cmCatViews_abi_cxx11_(&local_3b8,views_05);
                        cmSourceFile::AppendProperty(pcVar9,&local_370,&local_3b8,false);
LAB_003c95a6:
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                          operator_delete(local_3b8._M_dataplus._M_p,
                                          local_3b8.field_2._M_allocated_capacity + 1);
                        }
                      }
                      else {
                        local_2e8 = cmGlobalGenerator::FindGeneratorTarget
                                              (this->GlobalGenerator,local_2e0);
                        pcVar3 = this->Makefile;
                        local_2b8._0_8_ = local_2b8 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_2b8,"CMAKE_PCH_COPY_COMPILE_PDB","");
                        bVar21 = cmMakefile::IsOn(pcVar3,(string *)local_2b8);
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 0x10)) {
                          operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
                        }
                        if (bVar21) {
                          pcVar3 = this->Makefile;
                          local_2b8._24_8_ = (local_310->_M_dataplus)._M_p;
                          local_2b8._16_8_ = local_310->_M_string_length;
                          local_2b8._0_8_ = (pointer)0x6;
                          local_2b8._8_8_ = "CMAKE_";
                          local_298[0] = (char *)0xc;
                          local_298[1] = "_COMPILER_ID";
                          views_02._M_len = 3;
                          views_02._M_array = (iterator)local_2b8;
                          cmCatViews_abi_cxx11_(&local_3b8,views_02);
                          psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_3b8);
                          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
                          pcVar4 = (psVar10->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_370,pcVar4,pcVar4 + psVar10->_M_string_length)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                            operator_delete(local_3b8._M_dataplus._M_p,
                                            local_3b8.field_2._M_allocated_capacity + 1);
                          }
                          pcVar3 = this->Makefile;
                          local_2b8._24_8_ = (local_310->_M_dataplus)._M_p;
                          local_2b8._16_8_ = local_310->_M_string_length;
                          local_2b8._0_8_ = (pointer)0x6;
                          local_2b8._8_8_ = "CMAKE_";
                          local_298[0] = (char *)0x11;
                          local_298[1] = "_COMPILER_VERSION";
                          views_03._M_len = 3;
                          views_03._M_array = (iterator)local_2b8;
                          cmCatViews_abi_cxx11_(&local_308,views_03);
                          psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_308);
                          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                          pcVar4 = (psVar10->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_3b8,pcVar4,pcVar4 + psVar10->_M_string_length)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p != &local_308.field_2) {
                            operator_delete(local_308._M_dataplus._M_p,
                                            local_308.field_2._M_allocated_capacity + 1);
                          }
                          pcVar3 = this->Makefile;
                          local_2b8._24_8_ = (local_310->_M_dataplus)._M_p;
                          local_2b8._16_8_ = local_310->_M_string_length;
                          local_2b8._0_8_ = (pointer)0x6;
                          local_2b8._8_8_ = "CMAKE_";
                          local_298[0] = (undefined1 *)0x7;
                          local_298[1] = "_FLAGS_";
                          local_288[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_b8._M_string_length;
                          local_288[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_b8._M_dataplus._M_p;
                          views_04._M_len = 4;
                          views_04._M_array = (iterator)local_2b8;
                          cmCatViews_abi_cxx11_(&local_2d8,views_04);
                          psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_2d8);
                          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
                          pcVar4 = (psVar10->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_308,pcVar4,pcVar4 + psVar10->_M_string_length)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                            operator_delete(local_2d8._M_dataplus._M_p,
                                            local_2d8.field_2._M_allocated_capacity + 1);
                          }
                          GetMSVCDebugFormatName
                                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_2b8,this,local_378,target);
                          if (local_298[0]._0_1_ == (string)0x1) {
                            iVar6 = std::__cxx11::string::compare((char *)local_2b8);
                            bVar22 = iVar6 == 0;
                            iVar6 = std::__cxx11::string::compare((char *)local_2b8);
                            bVar21 = iVar6 == 0;
                          }
                          else {
                            lVar17 = std::__cxx11::string::find((char *)&local_308,0x6b0843,0);
                            bVar21 = true;
                            bVar22 = true;
                            if (lVar17 == -1) {
                              lVar17 = std::__cxx11::string::find((char *)&local_308,0x6b0847,0);
                              bVar22 = lVar17 != -1;
                            }
                            lVar17 = std::__cxx11::string::find((char *)&local_308,0x6b084b,0);
                            if (lVar17 == -1) {
                              lVar17 = std::__cxx11::string::find((char *)&local_308,0x6b084f,0);
                              bVar21 = lVar17 != -1;
                            }
                          }
                          if ((local_298[0]._0_1_ == (string)0x1) &&
                             (local_298[0] = (char *)((ulong)local_298[0] & 0xffffffffffffff00),
                             (undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10)) {
                            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
                          }
                          bVar5 = cmSystemTools::VersionCompare(OP_LESS,&local_3b8,"16.0");
                          if (bVar5) {
                            iVar6 = std::__cxx11::string::compare((char *)&local_370);
                            bVar5 = iVar6 == 0;
                          }
                          else {
                            bVar5 = false;
                          }
                          pcVar3 = this->Makefile;
                          local_2b8._0_8_ = local_2b8 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_2b8,"CMAKE_VS_PLATFORM_TOOLSET","");
                          psVar10 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_2b8);
                          iVar6 = std::__cxx11::string::compare((char *)psVar10);
                          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 0x10)) {
                            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
                          }
                          if (bVar22 || (bool)(bVar5 & iVar6 != 0)) {
                            local_2b8._0_8_ = local_2b8 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_2b8,".pdb","");
                            local_298[0] = (char *)local_288;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_298,".idb","");
                            __l._M_len = 2;
                            __l._M_array = (string *)local_2b8;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_2d8,__l,(allocator_type *)&local_f8);
                            CopyPchCompilePdb(this,local_378,target,local_2e0,local_2e8,
                                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&local_2d8);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&local_2d8);
                            lVar17 = -0x40;
                            puVar20 = (undefined1 *)local_288;
                            do {
                              if (puVar20 != *(undefined1 **)(puVar20 + 0xfffffffffffffff0)) {
                                operator_delete(*(undefined1 **)(puVar20 + 0xfffffffffffffff0),
                                                *(long *)puVar20 + 1);
                              }
                              puVar20 = puVar20 + 0xffffffffffffffe0;
                              lVar17 = lVar17 + 0x20;
                            } while (lVar17 != 0);
                          }
                          else if (bVar21) {
                            local_2b8._0_8_ = local_2b8 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_2b8,".pdb","");
                            __l_00._M_len = 1;
                            __l_00._M_array = (string *)local_2b8;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_2d8,__l_00,(allocator_type *)&local_f8);
                            CopyPchCompilePdb(this,local_378,target,local_2e0,local_2e8,
                                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&local_2d8);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&local_2d8);
                            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 0x10))
                            {
                              operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
                            }
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p != &local_308.field_2) {
                            operator_delete(local_308._M_dataplus._M_p,
                                            local_308.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                            operator_delete(local_3b8._M_dataplus._M_p,
                                            local_3b8.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_370._M_dataplus._M_p != &local_370.field_2) {
                            operator_delete(local_370._M_dataplus._M_p,
                                            CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                                                     local_370.field_2._M_local_buf[0]) + 1);
                          }
                        }
                        cmGeneratorTarget::GetPchFileObject
                                  (&local_370,local_2e8,local_378,local_310,pbVar16);
                        TVar7 = cmGeneratorTarget::GetType(target);
                        if (TVar7 != OBJECT_LIBRARY) {
                          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_3b8,"LINK_FLAGS_","");
                          TVar7 = cmGeneratorTarget::GetType(target);
                          if (TVar7 == STATIC_LIBRARY) {
                            std::__cxx11::string::_M_replace
                                      ((ulong)&local_3b8,0,(char *)local_3b8._M_string_length,
                                       0x6b00de);
                          }
                          pcVar2 = target->Target;
                          local_2b8._0_8_ = local_3b8._M_string_length;
                          local_2b8._8_8_ = local_3b8._M_dataplus._M_p;
                          local_2b8._16_8_ = local_b8._M_string_length;
                          local_2b8._24_8_ = local_b8._M_dataplus._M_p;
                          views_07._M_len = 2;
                          views_07._M_array = (iterator)local_2b8;
                          cmCatViews_abi_cxx11_(&local_308,views_07);
                          source._M_str = local_370._M_dataplus._M_p;
                          source._M_len = local_370._M_string_length;
                          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                                    (&local_f8,local_90,source,SHELL);
                          local_2b8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
                          local_2b8._8_8_ = " ";
                          local_2b8._16_8_ = local_f8._M_string_length;
                          local_2b8._24_8_ = local_f8._M_dataplus._M_p;
                          views_08._M_len = 2;
                          views_08._M_array = (iterator)local_2b8;
                          cmCatViews_abi_cxx11_(&local_2d8,views_08);
                          local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
                          cmTarget::AppendProperty
                                    (pcVar2,&local_308,&local_2d8,
                                     (optional<cmListFileBacktrace> *)local_2b8,true);
                          if ((local_2b8[0x10] == '\x01') &&
                             (local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00,
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_2b8._8_8_);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                            operator_delete(local_2d8._M_dataplus._M_p,
                                            local_2d8.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                            operator_delete(local_f8._M_dataplus._M_p,
                                            local_f8.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p != &local_308.field_2) {
                            operator_delete(local_308._M_dataplus._M_p,
                                            local_308.field_2._M_allocated_capacity + 1);
                          }
                          goto LAB_003c95a6;
                        }
                        TVar7 = cmGeneratorTarget::GetType(local_2e8);
                        if (TVar7 == OBJECT_LIBRARY) {
                          pcVar2 = target->Target;
                          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_3b8,"INTERFACE_LINK_LIBRARIES","");
                          local_2b8._24_8_ = (local_378->_M_dataplus)._M_p;
                          local_2b8._16_8_ = local_378->_M_string_length;
                          local_2b8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
                          local_2b8._8_8_ = "$<$<CONFIG:";
                          local_298[0] = (undefined1 *)0xe;
                          local_298[1] = ">:$<LINK_ONLY:";
                          local_288[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_370._M_string_length;
                          local_288[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_370._M_dataplus._M_p;
                          local_288[2] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
                          local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)0x6b0d3d;
                          views_06._M_len = 5;
                          views_06._M_array = (iterator)local_2b8;
                          cmCatViews_abi_cxx11_(&local_308,views_06);
                          local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
                          cmTarget::AppendProperty
                                    (pcVar2,&local_3b8,&local_308,
                                     (optional<cmListFileBacktrace> *)local_2b8,false);
                          if ((local_2b8[0x10] == '\x01') &&
                             (local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00,
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_2b8._8_8_);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_308._M_dataplus._M_p != &local_308.field_2) {
                            operator_delete(local_308._M_dataplus._M_p,
                                            local_308.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                            operator_delete(local_3b8._M_dataplus._M_p,
                                            local_3b8.field_2._M_allocated_capacity + 1);
                          }
                          cmGeneratorTarget::ClearLinkInterfaceCache(target);
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_370._M_dataplus._M_p != &local_370.field_2) {
                        sVar14 = CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                                          local_370.field_2._M_local_buf[0]);
                        _Var15._M_p = local_370._M_dataplus._M_p;
LAB_003c95d6:
                        operator_delete(_Var15._M_p,sVar14 + 1);
                      }
                    }
                    else {
                      local_2b8._0_8_ = local_2b8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2b8,"PCH_EXTENSION","");
                      cmSourceFile::SetProperty(pcVar9,(string *)local_2b8,cVar8);
                      sVar14 = local_2b8._16_8_;
                      _Var15._M_p = (pointer)local_2b8._0_8_;
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._0_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 0x10))
                      goto LAB_003c95d6;
                    }
                    pcVar9 = cmMakefile::GetOrCreateSource(this->Makefile,&local_330,false,Known);
                    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
                    local_370._M_string_length = 0;
                    local_370.field_2._M_local_buf[0] = '\0';
                    cmSourceFile::ResolveFullPath(pcVar9,&local_370,(string *)0x0);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_string_length
                        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,"Unable to resolve full path of PCH-header \'"
                                 ,0x2b);
                      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_2b8,local_330._M_dataplus._M_p,
                                           local_330._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,"\' assigned to target ",0x15);
                      psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(target);
                      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar12,(psVar10->_M_dataplus)._M_p,
                                           psVar10->_M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,", although its path is supposed to be known!",0x2c);
                      std::__cxx11::stringbuf::str();
                      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,
                                          &local_3b8,local_88);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                        operator_delete(local_3b8._M_dataplus._M_p,
                                        local_3b8.field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
                      std::ios_base::~ios_base(local_248);
                    }
                    cmGeneratorTarget::AddSource(target,&local_330,false);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_370._M_dataplus._M_p != &local_370.field_2) {
                      operator_delete(local_370._M_dataplus._M_p,
                                      CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                                               local_370.field_2._M_local_buf[0]) + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_350._M_dataplus._M_p != &local_350.field_2) {
                      operator_delete(local_350._M_dataplus._M_p,
                                      local_350.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_dataplus._M_p != &local_398.field_2) {
                operator_delete(local_398._M_dataplus._M_p,
                                (ulong)(local_398.field_2._M_allocated_capacity + 1));
              }
              pbVar16 = pbVar16 + 1;
            } while (pbVar16 != local_80);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_118);
          psVar10 = local_378;
        }
        lVar17 = local_100 + 0x20;
      } while (lVar17 != 0x80);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_138.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pbVar16 = psVar10 + 1;
    } while (pbVar16 != local_98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void cmLocalGenerator::AddPchDependencies(cmGeneratorTarget* target)
{
  std::vector<std::string> configsList =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  for (std::string const& config : configsList) {
    // FIXME: Refactor collection of sources to not evaluate object
    // libraries.
    std::vector<cmSourceFile*> sources;
    target->GetSourceFiles(sources, config);

    const std::string configUpper = cmSystemTools::UpperCase(config);
    static const std::array<std::string, 4> langs = { { "C", "CXX", "OBJC",
                                                        "OBJCXX" } };

    std::set<std::string> pchLangSet;
    if (this->GetGlobalGenerator()->IsXcode()) {
      for (const std::string& lang : langs) {
        const std::string pchHeader = target->GetPchHeader(config, lang, "");
        if (!pchHeader.empty()) {
          pchLangSet.emplace(lang);
        }
      }
    }

    for (const std::string& lang : langs) {
      auto langSources = std::count_if(
        sources.begin(), sources.end(), [lang](cmSourceFile* sf) {
          return lang == sf->GetLanguage() &&
            !sf->GetProperty("SKIP_PRECOMPILE_HEADERS");
        });
      if (langSources == 0) {
        continue;
      }

      std::vector<std::string> architectures;
      if (!this->GetGlobalGenerator()->IsXcode()) {
        target->GetAppleArchs(config, architectures);
      }
      if (architectures.empty()) {
        architectures.emplace_back();
      } else {
        std::string useMultiArchPch;
        for (const std::string& arch : architectures) {
          const std::string pchHeader =
            target->GetPchHeader(config, lang, arch);
          if (!pchHeader.empty()) {
            useMultiArchPch = cmStrCat(useMultiArchPch, ";-Xarch_", arch,
                                       ";-include", pchHeader);
          }
        }

        if (!useMultiArchPch.empty()) {

          target->Target->AppendProperty(
            cmStrCat(lang, "_COMPILE_OPTIONS_USE_PCH"),
            cmStrCat("$<$<CONFIG:", config, ">:", useMultiArchPch, ">"));
        }
      }

      for (const std::string& arch : architectures) {
        const std::string pchSource = target->GetPchSource(config, lang, arch);
        const std::string pchHeader = target->GetPchHeader(config, lang, arch);

        if (pchSource.empty() || pchHeader.empty()) {
          if (this->GetGlobalGenerator()->IsXcode() && !pchLangSet.empty()) {
            for (auto* sf : sources) {
              const auto sourceLanguage = sf->GetLanguage();
              if (!sourceLanguage.empty() &&
                  pchLangSet.find(sourceLanguage) == pchLangSet.end()) {
                sf->SetProperty("SKIP_PRECOMPILE_HEADERS", "ON");
              }
            }
          }
          continue;
        }

        cmValue pchExtension =
          this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");

        if (pchExtension.IsEmpty()) {
          continue;
        }

        cmValue ReuseFrom =
          target->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");

        auto* pch_sf = this->Makefile->GetOrCreateSource(
          pchSource, false, cmSourceFileLocationKind::Known);

        if (!this->GetGlobalGenerator()->IsXcode()) {
          if (!ReuseFrom) {
            target->AddSource(pchSource, true);
          }

          const std::string pchFile = target->GetPchFile(config, lang, arch);

          // Exclude the pch files from linking
          if (this->Makefile->IsOn("CMAKE_LINK_PCH")) {
            if (!ReuseFrom) {
              pch_sf->AppendProperty(
                "OBJECT_OUTPUTS",
                cmStrCat("$<$<CONFIG:", config, ">:", pchFile, ">"));
            } else {
              auto* reuseTarget =
                this->GlobalGenerator->FindGeneratorTarget(*ReuseFrom);

              if (this->Makefile->IsOn("CMAKE_PCH_COPY_COMPILE_PDB")) {

                const std::string compilerId =
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

                const std::string compilerVersion =
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_VERSION"));

                const std::string langFlags =
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_FLAGS_", configUpper));

                bool editAndContinueDebugInfo = false;
                bool programDatabaseDebugInfo = false;
                if (cm::optional<std::string> msvcDebugInformationFormat =
                      this->GetMSVCDebugFormatName(config, target)) {
                  editAndContinueDebugInfo =
                    *msvcDebugInformationFormat == "EditAndContinue";
                  programDatabaseDebugInfo =
                    *msvcDebugInformationFormat == "ProgramDatabase";
                } else {
                  editAndContinueDebugInfo =
                    langFlags.find("/ZI") != std::string::npos ||
                    langFlags.find("-ZI") != std::string::npos;
                  programDatabaseDebugInfo =
                    langFlags.find("/Zi") != std::string::npos ||
                    langFlags.find("-Zi") != std::string::npos;
                }

                // MSVC 2008 is producing both .pdb and .idb files with /Zi.
                bool msvc2008OrLess =
                  cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                                compilerVersion, "16.0") &&
                  compilerId == "MSVC";
                // but not when used via toolset -Tv90
                if (this->Makefile->GetSafeDefinition(
                      "CMAKE_VS_PLATFORM_TOOLSET") == "v90") {
                  msvc2008OrLess = false;
                }

                if (editAndContinueDebugInfo || msvc2008OrLess) {
                  this->CopyPchCompilePdb(config, target, *ReuseFrom,
                                          reuseTarget, { ".pdb", ".idb" });
                } else if (programDatabaseDebugInfo) {
                  this->CopyPchCompilePdb(config, target, *ReuseFrom,
                                          reuseTarget, { ".pdb" });
                }
              }

              // Link to the pch object file
              std::string pchSourceObj =
                reuseTarget->GetPchFileObject(config, lang, arch);

              if (target->GetType() != cmStateEnums::OBJECT_LIBRARY) {
                std::string linkerProperty = "LINK_FLAGS_";
                if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
                  linkerProperty = "STATIC_LIBRARY_FLAGS_";
                }
                target->Target->AppendProperty(
                  cmStrCat(linkerProperty, configUpper),
                  cmStrCat(" ",
                           this->ConvertToOutputFormat(pchSourceObj, SHELL)),
                  cm::nullopt, true);
              } else if (reuseTarget->GetType() ==
                         cmStateEnums::OBJECT_LIBRARY) {
                // FIXME: This can propagate more than one level, unlike
                // the rest of the object files in an object library.
                // Find another way to do this.
                target->Target->AppendProperty(
                  "INTERFACE_LINK_LIBRARIES",
                  cmStrCat("$<$<CONFIG:", config,
                           ">:$<LINK_ONLY:", pchSourceObj, ">>"));
                // We updated the link interface, so ensure it is recomputed.
                target->ClearLinkInterfaceCache();
              }
            }
          } else {
            pch_sf->SetProperty("PCH_EXTENSION", pchExtension);
          }

          // Add pchHeader to source files, which will
          // be grouped as "Precompile Header File"
          auto* pchHeader_sf = this->Makefile->GetOrCreateSource(
            pchHeader, false, cmSourceFileLocationKind::Known);
          std::string err;
          pchHeader_sf->ResolveFullPath(&err);
          if (!err.empty()) {
            std::ostringstream msg;
            msg << "Unable to resolve full path of PCH-header '" << pchHeader
                << "' assigned to target " << target->GetName()
                << ", although its path is supposed to be known!";
            this->IssueMessage(MessageType::FATAL_ERROR, msg.str());
          }
          target->AddSource(pchHeader);
        }
      }
    }
  }
}